

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

HighsModelStatus __thiscall
presolve::HPresolve::run(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  double *pdVar1;
  double rhs;
  int iVar2;
  HighsMipSolverData *pHVar3;
  int *piVar4;
  HighsMipSolver *mipsolver;
  uint *puVar5;
  HighsLp *pHVar6;
  pointer Rvalue;
  pointer Rindex;
  pointer piVar7;
  bool integral;
  Result RVar8;
  HighsInt HVar9;
  HighsModelStatus HVar10;
  int *piVar11;
  size_type __new_size;
  uint row;
  uint *puVar12;
  int local_bc;
  vector<double,_std::allocator<double>_> cutvals;
  vector<int,_std::allocator<int>_> cutinds;
  anon_class_16_2_81da6f95 reportReductions;
  
  this->presolve_status_ = kNotSet;
  this->shrinkProblemEnabled = true;
  postsolve_stack->debug_prev_row_upper = 0.0;
  postsolve_stack->debug_prev_col_upper = 0.0;
  postsolve_stack->debug_prev_row_lower = 0.0;
  postsolve_stack->debug_prev_numreductions = 0;
  postsolve_stack->debug_prev_col_lower = 0.0;
  reportReductions.this = this;
  reportReductions.postsolve_stack = postsolve_stack;
  RVar8 = presolve(this,postsolve_stack);
  if (RVar8 == kDualInfeasible) {
    this->presolve_status_ = kUnboundedOrInfeasible;
    run::anon_class_16_2_81da6f95::operator()(&reportReductions);
    return kUnboundedOrInfeasible;
  }
  if (RVar8 == kPrimalInfeasible) {
    this->presolve_status_ = kInfeasible;
    run::anon_class_16_2_81da6f95::operator()(&reportReductions);
LAB_00310ba7:
    HVar10 = kInfeasible;
  }
  else {
    run::anon_class_16_2_81da6f95::operator()(&reportReductions);
    shrinkProblem(this,postsolve_stack);
    if (this->mipsolver != (HighsMipSolver *)0x0) {
      pHVar3 = (this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      (pHVar3->cliquetable).inPresolve = false;
      HVar9 = numNonzeros(this);
      (pHVar3->cliquetable).maxEntries = HVar9 * 10 + 2000000;
      pHVar3 = (this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      HighsDomain::addCutpool(&pHVar3->domain,&pHVar3->cutpool);
      pHVar3 = (this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      HighsDomain::addConflictPool(&pHVar3->domain,&pHVar3->conflictPool);
      if (((this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->numRestarts != 0) {
        cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::reserve(&cutinds,(long)this->model->num_col_);
        std::vector<double,_std::allocator<double>_>::reserve(&cutvals,(long)this->model->num_col_);
        row = this->model->num_row_;
        local_bc = 0;
        while (0 < (int)row) {
          row = row - 1;
          if ((postsolve_stack->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[row] < this->mipsolver->orig_model_->num_row_) break;
          storeRow(this,row);
          if (cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish !=
              cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start) {
            cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
          }
          if (cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start) {
            cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          local_bc = local_bc + 1;
          piVar4 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (piVar11 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              piVar7 = cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,
              Rindex = cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
              Rvalue = cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start, piVar11 != piVar4; piVar11 = piVar11 + 1) {
            iVar2 = *piVar11;
            std::vector<int,_std::allocator<int>_>::push_back
                      (&cutinds,(this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + iVar2);
            std::vector<double,_std::allocator<double>_>::push_back
                      (&cutvals,(this->Avalue).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start + iVar2);
          }
          mipsolver = this->mipsolver;
          pHVar3 = (mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
          rhs = (this->model->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[row];
          if ((this->rowsizeImplInt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[row] +
              (this->rowsizeInteger).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[row] ==
              (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[row]) {
            integral = rowCoefficientsIntegral(this,row,1.0);
          }
          else {
            integral = false;
          }
          HighsCutPool::addCut
                    (&pHVar3->cutpool,mipsolver,Rindex,Rvalue,
                     (HighsInt)((ulong)((long)piVar7 - (long)Rindex) >> 2),rhs,integral,true,false,
                     false);
          markRowDeleted(this,row);
          puVar5 = (uint *)(this->rowpositions).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
          for (puVar12 = (uint *)(this->rowpositions).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start; puVar12 != puVar5;
              puVar12 = puVar12 + 1) {
            unlink(this,(char *)(ulong)*puVar12);
          }
        }
        pHVar6 = this->model;
        __new_size = (long)pHVar6->num_row_ - (long)local_bc;
        pHVar6->num_row_ = (HighsInt)__new_size;
        std::vector<double,_std::allocator<double>_>::resize(&pHVar6->row_lower_,__new_size);
        std::vector<double,_std::allocator<double>_>::resize
                  (&this->model->row_upper_,(long)this->model->num_row_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(&this->model->row_names_,(long)this->model->num_row_);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&cutvals.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&cutinds.super__Vector_base<int,_std::allocator<int>_>);
      }
    }
    pHVar6 = this->model;
    toCSC(this,&(pHVar6->a_matrix_).value_,&(pHVar6->a_matrix_).index_,&(pHVar6->a_matrix_).start_);
    pHVar6 = this->model;
    if (pHVar6->num_col_ != 0) {
      this->presolve_status_ =
           (uint)((postsolve_stack->reductions).
                  super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                 (postsolve_stack->reductions).
                 super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) * 3;
      if (this->mipsolver != (HighsMipSolver *)0x0) {
        return kMin;
      }
      if ((this->options->super_HighsOptionsStruct).use_implied_bounds_from_presolve != true) {
        return kMin;
      }
      setRelaxedImpliedBounds(this);
      return kMin;
    }
    if (this->mipsolver == (HighsMipSolver *)0x0) {
      if (pHVar6->num_row_ != 0) {
        this->presolve_status_ = kNotPresolved;
        return kMin;
      }
    }
    else {
      pHVar3 = (this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      pdVar1 = &pHVar3->upper_limit;
      if (*pdVar1 <= pHVar6->offset_ && pHVar6->offset_ != *pdVar1) {
        this->presolve_status_ = kInfeasible;
        goto LAB_00310ba7;
      }
      pHVar3->lower_bound = 0.0;
    }
    this->presolve_status_ = kReducedToEmpty;
    HVar10 = kOptimal;
  }
  return HVar10;
}

Assistant:

HighsModelStatus HPresolve::run(HighsPostsolveStack& postsolve_stack) {
  presolve_status_ = HighsPresolveStatus::kNotSet;
  shrinkProblemEnabled = true;
  postsolve_stack.debug_prev_numreductions = 0;
  postsolve_stack.debug_prev_col_lower = 0;
  postsolve_stack.debug_prev_col_upper = 0;
  postsolve_stack.debug_prev_row_lower = 0;
  postsolve_stack.debug_prev_row_upper = 0;
  // Presolve should only be called with a model that has a non-empty
  // constraint matrix unless it has no rows
  assert(model->a_matrix_.numNz() || model->num_row_ == 0);
  auto reportReductions = [&]() {
    if (options->presolve != kHighsOffString &&
        reductionLimit < kHighsSize_tInf) {
      highsLogUser(options->log_options, HighsLogType::kInfo,
                   "Presolve performed %" PRId64 " of %" PRId64
                   " permitted reductions\n",
                   postsolve_stack.numReductions(), reductionLimit);
    }
  };
  switch (presolve(postsolve_stack)) {
    case Result::kStopped:
    case Result::kOk:
      break;
    case Result::kPrimalInfeasible:
      presolve_status_ = HighsPresolveStatus::kInfeasible;
      reportReductions();
      return HighsModelStatus::kInfeasible;
    case Result::kDualInfeasible:
      presolve_status_ = HighsPresolveStatus::kUnboundedOrInfeasible;
      reportReductions();
      return HighsModelStatus::kUnboundedOrInfeasible;
  }
  reportReductions();

  shrinkProblem(postsolve_stack);

  if (mipsolver != nullptr) {
    mipsolver->mipdata_->cliquetable.setPresolveFlag(false);
    mipsolver->mipdata_->cliquetable.setMaxEntries(numNonzeros());
    mipsolver->mipdata_->domain.addCutpool(mipsolver->mipdata_->cutpool);
    mipsolver->mipdata_->domain.addConflictPool(
        mipsolver->mipdata_->conflictPool);

    if (mipsolver->mipdata_->numRestarts != 0) {
      std::vector<HighsInt> cutinds;
      std::vector<double> cutvals;
      cutinds.reserve(model->num_col_);
      cutvals.reserve(model->num_col_);
      HighsInt numcuts = 0;
      for (HighsInt i = model->num_row_ - 1; i >= 0; --i) {
        // check if we already reached the original rows
        if (postsolve_stack.getOrigRowIndex(i) <
            mipsolver->orig_model_->num_row_)
          break;

        // row is a cut, remove it from matrix but add to cutpool
        ++numcuts;
        storeRow(i);
        cutinds.clear();
        cutvals.clear();
        for (HighsInt j : rowpositions) {
          cutinds.push_back(Acol[j]);
          cutvals.push_back(Avalue[j]);
        }

        mipsolver->mipdata_->cutpool.addCut(
            *mipsolver, cutinds.data(), cutvals.data(), cutinds.size(),
            model->row_upper_[i],
            rowsizeInteger[i] + rowsizeImplInt[i] == rowsize[i] &&
                rowCoefficientsIntegral(i, 1.0),
            true, false, false);

        markRowDeleted(i);
        for (HighsInt j : rowpositions) unlink(j);
      }

      model->num_row_ -= numcuts;
      model->row_lower_.resize(model->num_row_);
      model->row_upper_.resize(model->num_row_);
      model->row_names_.resize(model->num_row_);
    }
  }

  toCSC(model->a_matrix_.value_, model->a_matrix_.index_,
        model->a_matrix_.start_);

  if (model->num_col_ == 0) {
    // Reduced to empty
    if (mipsolver) {
      if (model->offset_ > mipsolver->mipdata_->upper_limit) {
        presolve_status_ = HighsPresolveStatus::kInfeasible;
        return HighsModelStatus::kInfeasible;
      }
      mipsolver->mipdata_->lower_bound = 0;
    } else {
      assert(model->num_row_ == 0);
      if (model->num_row_ != 0) {
        presolve_status_ = HighsPresolveStatus::kNotPresolved;
        return HighsModelStatus::kNotset;
      }
    }
    presolve_status_ = HighsPresolveStatus::kReducedToEmpty;
    return HighsModelStatus::kOptimal;
  } else if (postsolve_stack.numReductions() > 0) {
    // Reductions performed
    presolve_status_ = HighsPresolveStatus::kReduced;
  } else {
    // No reductions performed
    presolve_status_ = HighsPresolveStatus::kNotReduced;
  }

  if (!mipsolver && options->use_implied_bounds_from_presolve)
    setRelaxedImpliedBounds();

  assert(presolve_status_ != HighsPresolveStatus::kNotSet);
  return HighsModelStatus::kNotset;
}